

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.c
# Opt level: O1

void board_print(Board *board,_Bool showDownCards)

{
  SPOTTYPE SVar1;
  ulong uVar2;
  ulong uVar3;
  uchar spotTypesCount;
  byte local_39;
  SPOTTYPE *local_38;
  
  local_38 = board_getSpotTypes(board,&local_39);
  if ((ulong)local_39 != 0) {
    uVar2 = 0;
    do {
      if (board->spotsCount != '\0') {
        SVar1 = local_38[uVar2];
        uVar3 = 0;
        do {
          if (board->spots[uVar3]->type == SVar1) {
            spot_print(board->spots[uVar3],showDownCards);
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 < board->spotsCount);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 != local_39);
  }
  free(local_38);
  return;
}

Assistant:

void board_print(Board * board, bool showDownCards)
{
	unsigned char i, j, spotTypesCount;
	Spot * spot;
	SPOTTYPE spotType;
	SPOTTYPE * spotTypes = board_getSpotTypes(board, &spotTypesCount);

	for(i=0;i<spotTypesCount;i++)
	{
		spotType = spotTypes[i];
		for(j=0;j<board->spotsCount;j++)
		{
			spot = board->spots[j];
			if(spot->type==spotType)
				spot_print(spot, showDownCards);
		}
	}

	free(spotTypes);
}